

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PeleLM.cpp
# Opt level: O1

void PeleLM::init_once(void)

{
  char *pcVar1;
  ostringstream *poVar2;
  pointer pbVar3;
  pointer pbVar4;
  long lVar5;
  undefined8 uVar6;
  bool bVar7;
  bool bVar8;
  int iVar9;
  int iVar10;
  long *plVar11;
  mapped_type *pmVar12;
  StateDescriptor *this;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar13;
  mapped_type *pmVar14;
  size_type *psVar15;
  long lVar16;
  char *__end;
  long lVar17;
  bool bVar18;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  int dummy_State_Type;
  int tRhoRT;
  int tRhoH;
  int tTemp;
  Vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  otherKeys;
  string ppStr;
  Vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  specNames;
  ParmParse pp;
  int local_2bc;
  string local_2b8;
  int local_294;
  int local_290;
  int local_28c;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_288;
  undefined1 local_270 [24];
  undefined8 uStack_258;
  undefined1 *local_250 [2];
  undefined1 local_240 [16];
  long *local_230 [2];
  long local_220 [39];
  key_type local_e8;
  string local_c8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_a8;
  ParmParse local_88;
  
  local_28c = -1;
  pcVar1 = local_270 + 0x10;
  local_270._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_270,"temp","");
  bVar7 = amrex::AmrLevel::isStateVariable((string *)local_270,&local_2bc,&local_28c);
  if ((char *)local_270._0_8_ != pcVar1) {
    operator_delete((void *)local_270._0_8_,local_270._16_8_ + 1);
  }
  if (local_28c != NavierStokesBase::Temp) {
    amrex::Assert_host("tTemp == Temp",
                       "/workspace/llm4binary/github/license_c_cmakelists/AMReX-Combustion[P]PeleLM/Source/PeleLM.cpp"
                       ,0x438,(char *)0x0);
  }
  local_290 = -1;
  if (bVar7 && local_2bc == 0) {
    local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_c8,"rhoh","");
    bVar7 = amrex::AmrLevel::isStateVariable(&local_c8,&local_2bc,&local_290);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
      operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    bVar7 = false;
  }
  if (local_290 != RhoH) {
    amrex::Assert_host("tRhoH == RhoH",
                       "/workspace/llm4binary/github/license_c_cmakelists/AMReX-Combustion[P]PeleLM/Source/PeleLM.cpp"
                       ,0x43d,(char *)0x0);
  }
  bVar18 = local_2bc == 0;
  local_294 = -1;
  local_270._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_270,"RhoRT","");
  bVar8 = amrex::AmrLevel::isStateVariable((string *)local_270,&local_2bc,&local_294);
  have_rhort = (int)bVar8;
  if ((char *)local_270._0_8_ != pcVar1) {
    operator_delete((void *)local_270._0_8_,local_270._16_8_ + 1);
  }
  if (local_294 != RhoRT) {
    amrex::Assert_host("tRhoRT == RhoRT",
                       "/workspace/llm4binary/github/license_c_cmakelists/AMReX-Combustion[P]PeleLM/Source/PeleLM.cpp"
                       ,0x442,(char *)0x0);
  }
  have_rhort = (int)(local_2bc == 0 && have_rhort != 0);
  if ((bVar7 & bVar18) == 0) {
    amrex::Abort_host("PeleLM::init_once(): RhoH & Temp must both be the state");
  }
  if (NavierStokesBase::Temp < RhoH) {
    amrex::Abort_host("PeleLM::init_once(): must have RhoH < Temp");
  }
  if (NavierStokesBase::advectionType.super_vector<AdvectionForm,_std::allocator<AdvectionForm>_>.
      super__Vector_base<AdvectionForm,_std::allocator<AdvectionForm>_>._M_impl.
      super__Vector_impl_data._M_start[NavierStokesBase::Temp] == Conservative) {
    amrex::Abort_host("PeleLM::init_once(): Temp must be non-conservative");
  }
  if (NavierStokesBase::advectionType.super_vector<AdvectionForm,_std::allocator<AdvectionForm>_>.
      super__Vector_base<AdvectionForm,_std::allocator<AdvectionForm>_>._M_impl.
      super__Vector_impl_data._M_start[RhoH] != Conservative) {
    amrex::Abort_host("PeleLM::init_once(): RhoH must be conservative");
  }
  last_spec = first_spec + 8;
  lVar17 = (long)first_spec + -1;
  do {
    if (NavierStokesBase::advectionType.super_vector<AdvectionForm,_std::allocator<AdvectionForm>_>.
        super__Vector_base<AdvectionForm,_std::allocator<AdvectionForm>_>._M_impl.
        super__Vector_impl_data._M_start[lVar17 + 1] != Conservative) {
      amrex::Error_host("PeleLM::init_once: species must be conservative");
    }
    lVar17 = lVar17 + 1;
  } while (lVar17 < last_spec);
  lVar17 = (long)first_spec;
  if (first_spec < last_spec) {
    iVar9 = NavierStokesBase::is_diffusive.super_vector<int,_std::allocator<int>_>.
            super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
            [lVar17];
    do {
      if (NavierStokesBase::is_diffusive.super_vector<int,_std::allocator<int>_>.
          super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
          [lVar17 + 1] != iVar9) {
        amrex::Error_host("PeleLM::init_once: Le != 1; diffuse");
      }
      lVar17 = lVar17 + 1;
    } while (lVar17 < last_spec);
  }
  local_270._0_8_ = (pointer)0xbff0000000000000;
  std::vector<double,_std::allocator<double>_>::resize
            (&typical_values.super_vector<double,_std::allocator<double>_>,
             (long)NavierStokesBase::NUM_STATE,(value_type_conflict2 *)local_270);
  typical_values.super_vector<double,_std::allocator<double>_>.
  super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start[RhoH]
       = -10000000000.0;
  local_a8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_a8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_a8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pele::physics::eos::speciesNames<pele::physics::eos::Fuego>
            ((Vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&local_a8);
  local_270._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_270,"ht","");
  amrex::ParmParse::ParmParse(&local_88,(string *)local_270);
  if ((char *)local_270._0_8_ != pcVar1) {
    operator_delete((void *)local_270._0_8_,local_270._16_8_ + 1);
  }
  lVar17 = 0;
  do {
    local_2b8._M_dataplus._M_p = (pointer)&local_2b8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_2b8,"typValY_","");
    plVar11 = (long *)std::__cxx11::string::_M_append
                                ((char *)&local_2b8,
                                 *(ulong *)((long)&((local_a8.
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->
                                                  _M_dataplus)._M_p + lVar17));
    local_270._0_8_ = local_270 + 0x10;
    psVar15 = (size_type *)(plVar11 + 2);
    if ((size_type *)*plVar11 == psVar15) {
      local_270._16_8_ = *psVar15;
      uStack_258 = plVar11[3];
    }
    else {
      local_270._16_8_ = *psVar15;
      local_270._0_8_ = (size_type *)*plVar11;
    }
    local_270._8_8_ = plVar11[1];
    *plVar11 = (long)psVar15;
    plVar11[1] = 0;
    *(undefined1 *)(plVar11 + 2) = 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
      operator_delete(local_2b8._M_dataplus._M_p,local_2b8.field_2._M_allocated_capacity + 1);
    }
    iVar9 = amrex::ParmParse::countval(&local_88,(char *)local_270._0_8_,-1);
    uVar6 = local_270._0_8_;
    if (0 < iVar9) {
      pmVar12 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
                ::operator[](&typical_values_FileVals_abi_cxx11_,
                             (key_type *)
                             ((long)&((local_a8.
                                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p
                             + lVar17));
      amrex::ParmParse::get(&local_88,(char *)uVar6,pmVar12,0);
    }
    if ((undefined1 *)local_270._0_8_ != local_270 + 0x10) {
      operator_delete((void *)local_270._0_8_,local_270._16_8_ + 1);
    }
    lVar17 = lVar17 + 0x20;
  } while (lVar17 != 0x120);
  local_270._0_8_ = local_270 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_270,"Temp","");
  local_250[0] = local_240;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_250,"RhoH","");
  plVar11 = local_220;
  local_230[0] = plVar11;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_230,"Vel","");
  __l._M_len = 3;
  __l._M_array = (iterator)local_270;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_288,__l,(allocator_type *)&local_2b8);
  lVar17 = -0x60;
  do {
    if (plVar11 != (long *)plVar11[-2]) {
      operator_delete((long *)plVar11[-2],*plVar11 + 1);
    }
    plVar11 = plVar11 + -4;
    lVar17 = lVar17 + 0x20;
  } while (lVar17 != 0);
  if (local_288.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      local_288.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start &&
      -1 < (long)local_288.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
           (long)local_288.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start) {
    lVar16 = 0;
    lVar17 = 0;
    do {
      local_2b8._M_dataplus._M_p = (pointer)&local_2b8.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_2b8,"typVal_","");
      plVar11 = (long *)std::__cxx11::string::_M_append
                                  ((char *)&local_2b8,
                                   *(ulong *)((long)&((local_288.
                                                                                                              
                                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->
                                                  _M_dataplus)._M_p + lVar16));
      local_270._0_8_ = local_270 + 0x10;
      psVar15 = (size_type *)(plVar11 + 2);
      if ((size_type *)*plVar11 == psVar15) {
        local_270._16_8_ = *psVar15;
        uStack_258 = plVar11[3];
      }
      else {
        local_270._16_8_ = *psVar15;
        local_270._0_8_ = (size_type *)*plVar11;
      }
      local_270._8_8_ = plVar11[1];
      *plVar11 = (long)psVar15;
      plVar11[1] = 0;
      *(undefined1 *)(plVar11 + 2) = 0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
        operator_delete(local_2b8._M_dataplus._M_p,local_2b8.field_2._M_allocated_capacity + 1);
      }
      iVar9 = amrex::ParmParse::countval(&local_88,(char *)local_270._0_8_,-1);
      uVar6 = local_270._0_8_;
      if (0 < iVar9) {
        pmVar12 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
                  ::operator[](&typical_values_FileVals_abi_cxx11_,
                               (key_type *)
                               ((long)&((local_288.
                                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus).
                                       _M_p + lVar16));
        amrex::ParmParse::get(&local_88,(char *)uVar6,pmVar12,0);
      }
      if ((undefined1 *)local_270._0_8_ != local_270 + 0x10) {
        operator_delete((void *)local_270._0_8_,local_270._16_8_ + 1);
      }
      lVar17 = lVar17 + 1;
      lVar16 = lVar16 + 0x20;
    } while (lVar17 < (long)local_288.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)local_288.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 5);
  }
  iVar9 = RhoYdot_Type;
  if (RhoYdot_Type < 0) {
    bVar7 = false;
  }
  else {
    iVar10 = amrex::DescriptorList::size((DescriptorList *)amrex::AmrLevel::desc_lst);
    if (iVar9 < iVar10) {
      bVar7 = RhoYdot_Type != 0 && RhoYdot_Type != NavierStokesBase::Divu_Type;
    }
    else {
      bVar7 = false;
    }
  }
  amrex::ParmParse::query
            (&local_88,"chem_box_chop_threshold",&(anonymous_namespace)::chem_box_chop_threshold,0);
  if ((anonymous_namespace)::chem_box_chop_threshold < 1) {
    (anonymous_namespace)::chem_box_chop_threshold = 4;
  }
  if (!bVar7) {
    amrex::Error_host("PeleLM::init_once(): need RhoYdot_Type if do_chemistry");
  }
  this = amrex::DescriptorList::operator[]((DescriptorList *)amrex::AmrLevel::desc_lst,RhoYdot_Type)
  ;
  iVar9 = amrex::StateDescriptor::nComp(this);
  if (iVar9 < 9) {
    amrex::Error_host("PeleLM::init_once(): RhoYdot_Type needs NUM_SPECIES components");
  }
  if (unity_Le != 0) {
    if ((schmidt != prandtl) || (NAN(schmidt) || NAN(prandtl))) {
      if (NavierStokesBase::verbose != 0) {
        local_270._8_8_ = amrex::OutStream();
        poVar2 = (ostringstream *)(local_270 + 0x10);
        local_270._4_4_ = *(undefined4 *)(DAT_00756620 + -0x48);
        local_270._0_4_ = *(undefined4 *)(DAT_00756620 + -0x30);
        std::__cxx11::ostringstream::ostringstream(poVar2);
        *(undefined8 *)((long)local_250 + *(long *)(local_270._16_8_ - 0x18) + -8) =
             *(undefined8 *)(local_270._8_8_ + *(long *)(*(long *)local_270._8_8_ + -0x18) + 8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar2,"**************** WARNING ***************\n",0x29);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar2,"PeleLM::init_once() : currently must have",0x29);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar2,"equal Schmidt and Prandtl numbers unless !unity_Le.\n",0x34);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar2,"Setting Schmidt = Prandtl\n",0x1a);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar2,"**************** WARNING ***************\n",0x29);
        amrex::Print::~Print((Print *)local_270);
      }
      schmidt = prandtl;
    }
  }
  NavierStokesBase::num_state_type =
       amrex::DescriptorList::size((DescriptorList *)amrex::AmrLevel::desc_lst);
  if (NavierStokesBase::verbose != 0) {
    local_270._8_8_ = amrex::OutStream();
    poVar2 = (ostringstream *)(local_270 + 0x10);
    local_270._4_4_ = *(undefined4 *)(DAT_00756620 + -0x48);
    local_270._0_4_ = *(undefined4 *)(DAT_00756620 + -0x30);
    std::__cxx11::ostringstream::ostringstream(poVar2);
    *(undefined8 *)((long)local_250 + *(long *)(local_270._16_8_ - 0x18) + -8) =
         *(undefined8 *)(local_270._8_8_ + *(long *)(*(long *)local_270._8_8_ + -0x18) + 8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar2,"PeleLM::init_once(): num_state_type = ",0x26);
    std::ostream::operator<<(poVar2,NavierStokesBase::num_state_type);
    local_2b8._M_dataplus._M_p._0_1_ = 10;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2,(char *)&local_2b8,1);
    amrex::Print::~Print((Print *)local_270);
  }
  amrex::ParmParse::query(&local_88,"plot_reactions",&plot_reactions,0);
  if (plot_reactions == true) {
    local_270._0_8_ = local_270 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_270,"REACTIONS","");
    pvVar13 = &std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_amrex::Vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_amrex::Vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
               ::operator[](&auxDiag_names_abi_cxx11_,(key_type *)local_270)->
               super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::resize(pvVar13,0x15);
    if ((undefined1 *)local_270._0_8_ != local_270 + 0x10) {
      operator_delete((void *)local_270._0_8_,local_270._16_8_ + 1);
    }
    local_270._8_8_ = amrex::OutStream();
    poVar2 = (ostringstream *)(local_270 + 0x10);
    local_270._4_4_ = *(undefined4 *)(DAT_00756620 + -0x48);
    local_270._0_4_ = *(undefined4 *)(DAT_00756620 + -0x30);
    std::__cxx11::ostringstream::ostringstream(poVar2);
    *(undefined8 *)((long)local_250 + *(long *)(local_270._16_8_ - 0x18) + -8) =
         *(undefined8 *)(local_270._8_8_ + *(long *)(*(long *)local_270._8_8_ + -0x18) + 8);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2,"NUM_REACTIONS = ",0x10);
    std::ostream::operator<<(poVar2,0x15);
    local_2b8._M_dataplus._M_p._0_1_ = 10;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2,(char *)&local_2b8,1);
    amrex::Print::~Print((Print *)local_270);
    lVar17 = 0;
    lVar16 = 0;
    while( true ) {
      local_270._0_8_ = poVar2;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_270,"REACTIONS","");
      pmVar14 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_amrex::Vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_amrex::Vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                ::operator[](&auxDiag_names_abi_cxx11_,(key_type *)local_270);
      pbVar3 = (pmVar14->
               super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      pbVar4 = (pmVar14->
               super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if ((ostringstream *)local_270._0_8_ != poVar2) {
        operator_delete((void *)local_270._0_8_,local_270._16_8_ + 1);
      }
      if ((long)pbVar3 - (long)pbVar4 >> 5 <= lVar16) break;
      local_2b8._M_dataplus._M_p = (pointer)&local_2b8.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_2b8,"R","");
      amrex::Concatenate((string *)local_270,&local_2b8,(int)lVar16 + 1,5);
      local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"REACTIONS","");
      pmVar14 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_amrex::Vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_amrex::Vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                ::operator[](&auxDiag_names_abi_cxx11_,&local_e8);
      std::__cxx11::string::operator=
                ((string *)
                 ((long)&(((pmVar14->
                           super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ).
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p + lVar17),
                 (string *)local_270);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
        operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
      }
      if ((ostringstream *)local_270._0_8_ != poVar2) {
        operator_delete((void *)local_270._0_8_,local_270._16_8_ + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
        operator_delete(local_2b8._M_dataplus._M_p,local_2b8.field_2._M_allocated_capacity + 1);
      }
      lVar17 = lVar17 + 0x20;
      lVar16 = lVar16 + 1;
    }
    local_270._8_8_ = amrex::OutStream();
    poVar2 = (ostringstream *)(local_270 + 0x10);
    local_270._4_4_ = *(undefined4 *)(DAT_00756620 + -0x48);
    local_270._0_4_ = *(undefined4 *)(DAT_00756620 + -0x30);
    std::__cxx11::ostringstream::ostringstream(poVar2);
    *(undefined8 *)((long)local_250 + *(long *)(local_270._16_8_ - 0x18) + -8) =
         *(undefined8 *)(local_270._8_8_ + *(long *)(*(long *)local_270._8_8_ + -0x18) + 8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar2,"***** Make sure to increase amr.regrid_int !!!!!",0x30);
    local_2b8._M_dataplus._M_p._0_1_ = 10;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar2,(char *)&local_2b8,1);
    amrex::Print::~Print((Print *)local_270);
  }
  amrex::ParmParse::query(&local_88,"plot_consumption",&plot_consumption,0);
  amrex::ParmParse::query(&local_88,"plot_auxDiags",&plot_consumption,0);
  if ((plot_consumption == true) &&
     (consumptionName_abi_cxx11_.
      super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      consumptionName_abi_cxx11_.
      super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start &&
      -1 < (long)consumptionName_abi_cxx11_.
                 super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 .
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
           (long)consumptionName_abi_cxx11_.
                 super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 .
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start)) {
    local_270._0_8_ = local_270 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_270,"CONSUMPTION","");
    pvVar13 = &std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_amrex::Vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_amrex::Vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
               ::operator[](&auxDiag_names_abi_cxx11_,(key_type *)local_270)->
               super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::resize(pvVar13,(long)consumptionName_abi_cxx11_.
                           super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                     (long)consumptionName_abi_cxx11_.
                           super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           .
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start >> 5);
    if ((undefined1 *)local_270._0_8_ != local_270 + 0x10) {
      operator_delete((void *)local_270._0_8_,local_270._16_8_ + 1);
    }
    if (0 < (long)consumptionName_abi_cxx11_.
                  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  .
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)consumptionName_abi_cxx11_.
                  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  .
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start) {
      lVar16 = 0;
      lVar17 = 0;
      do {
        local_270._0_8_ = local_270 + 0x10;
        lVar5 = *(long *)((long)&((consumptionName_abi_cxx11_.
                                   super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   .
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p +
                         lVar16);
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_270,lVar5,
                   *(long *)((long)&(consumptionName_abi_cxx11_.
                                     super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     .
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start)->_M_string_length +
                            lVar16) + lVar5);
        std::__cxx11::string::append((char *)local_270);
        local_2b8._M_dataplus._M_p = (pointer)&local_2b8.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_2b8,"CONSUMPTION","");
        pmVar14 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_amrex::Vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_amrex::Vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                  ::operator[](&auxDiag_names_abi_cxx11_,&local_2b8);
        std::__cxx11::string::operator=
                  ((string *)
                   ((long)&(((pmVar14->
                             super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ).
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p + lVar16)
                   ,(string *)local_270);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
          operator_delete(local_2b8._M_dataplus._M_p,local_2b8.field_2._M_allocated_capacity + 1);
        }
        if ((undefined1 *)local_270._0_8_ != local_270 + 0x10) {
          operator_delete((void *)local_270._0_8_,local_270._16_8_ + 1);
        }
        lVar17 = lVar17 + 1;
        lVar16 = lVar16 + 0x20;
      } while (lVar17 < (long)consumptionName_abi_cxx11_.
                              super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              .
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                        (long)consumptionName_abi_cxx11_.
                              super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              .
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start >> 5);
    }
  }
  amrex::ParmParse::query(&local_88,"plot_heat_release",&plot_heat_release,0);
  pcVar1 = local_270 + 0x10;
  if (plot_heat_release == true) {
    local_270._0_8_ = pcVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_270,"HEATRELEASE","");
    pvVar13 = &std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_amrex::Vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_amrex::Vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
               ::operator[](&auxDiag_names_abi_cxx11_,(key_type *)local_270)->
               super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::resize(pvVar13,1);
    if ((char *)local_270._0_8_ != pcVar1) {
      operator_delete((void *)local_270._0_8_,local_270._16_8_ + 1);
    }
    local_270._0_8_ = pcVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_270,"HEATRELEASE","");
    pmVar14 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_amrex::Vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_amrex::Vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
              ::operator[](&auxDiag_names_abi_cxx11_,(key_type *)local_270);
    pbVar3 = (pmVar14->
             super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    std::__cxx11::string::_M_replace((ulong)pbVar3,0,(char *)pbVar3->_M_string_length,0x69bb91);
    if ((char *)local_270._0_8_ != pcVar1) {
      operator_delete((void *)local_270._0_8_,local_270._16_8_ + 1);
    }
  }
  init_once_done = 1;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_288);
  std::
  deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~deque((deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&local_88);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_a8);
  return;
}

Assistant:

void
PeleLM::init_once ()
{
   //
   // Computes the static variables unique to PeleLM.
   // Check that (some) things are set up correctly.
   //
   int dummy_State_Type;

   int tTemp = -1;
   int have_temp = isStateVariable("temp", dummy_State_Type, tTemp);
   AMREX_ALWAYS_ASSERT(tTemp == Temp);

   have_temp = have_temp && State_Type == dummy_State_Type;
   int tRhoH = -1;
   have_temp = have_temp && isStateVariable("rhoh", dummy_State_Type, tRhoH);
   AMREX_ALWAYS_ASSERT(tRhoH == RhoH);
   have_temp = have_temp && State_Type == dummy_State_Type;

   int tRhoRT = -1;
   have_rhort = isStateVariable("RhoRT", dummy_State_Type, tRhoRT);
   AMREX_ALWAYS_ASSERT(tRhoRT == RhoRT);
   have_rhort = have_rhort && State_Type == dummy_State_Type;

   if (!have_temp)
     amrex::Abort("PeleLM::init_once(): RhoH & Temp must both be the state");

   if (Temp < RhoH)
     amrex::Abort("PeleLM::init_once(): must have RhoH < Temp");
   //
   // Temperature must be non-conservative, rho*h must be conservative.
   //
   if (advectionType[Temp] == Conservative)
     amrex::Abort("PeleLM::init_once(): Temp must be non-conservative");

   if (advectionType[RhoH] != Conservative)
     amrex::Abort("PeleLM::init_once(): RhoH must be conservative");
   //
   // Species checks.
   //
   AMREX_ASSERT(Temp > RhoH && RhoH > Density);
   //
   // Here we want to count relative to Density instead of relative
   // to RhoH, so we can put RhoH after the species instead of before.
   // This logic should work in both cases.
   last_spec  = first_spec + NUM_SPECIES - 1;

   for (int i = first_spec; i <= last_spec; i++)
      if (advectionType[i] != Conservative)
         amrex::Error("PeleLM::init_once: species must be conservative");

   int diffuse_spec = is_diffusive[first_spec];
   for (int i = first_spec+1; i <= last_spec; i++) {
      if (is_diffusive[i] != diffuse_spec) {
         amrex::Error("PeleLM::init_once: Le != 1; diffuse");
      }
   }

   //
   // make space for typical values
   //
   typical_values.resize(NUM_STATE,-1); // -ve means don't use for anything
   typical_values[RhoH] = typical_RhoH_value_default;

   Vector<std::string> specNames;
   pele::physics::eos::speciesNames<pele::physics::PhysicsType::eos_type>(specNames);
   ParmParse pp("ht");
   for (int i=0; i<NUM_SPECIES; ++i) {
     const std::string ppStr = std::string("typValY_") + specNames[i];
     if (pp.countval(ppStr.c_str())>0) {
       pp.get(ppStr.c_str(),typical_values_FileVals[specNames[i]]);
     }
   }
   Vector<std::string> otherKeys = {"Temp", "RhoH", "Vel"};
   for (int i=0; i<otherKeys.size(); ++i) {
     const std::string ppStr(std::string("typVal_")+otherKeys[i]);
     if (pp.countval(ppStr.c_str())>0) {
       pp.get(ppStr.c_str(),typical_values_FileVals[otherKeys[i]]);
     }
   }

   //
   // Chemistry.
   //
   int ydot_good = RhoYdot_Type >= 0 && RhoYdot_Type <  desc_lst.size()
                                     && RhoYdot_Type != Divu_Type
                                     && RhoYdot_Type != State_Type;


   //
   // This is the minimum number of boxes per MPI proc that I want
   // when chopping up chemistry work.
   //
   pp.query("chem_box_chop_threshold",chem_box_chop_threshold);

   if (chem_box_chop_threshold <= 0)
   {
#ifdef AMREX_USE_OMP
     chem_box_chop_threshold = 8;
#else
     chem_box_chop_threshold = 4;
#endif
   }

   if (!ydot_good)
      amrex::Error("PeleLM::init_once(): need RhoYdot_Type if do_chemistry");

   if (desc_lst[RhoYdot_Type].nComp() < NUM_SPECIES)
      amrex::Error("PeleLM::init_once(): RhoYdot_Type needs NUM_SPECIES components");
   //
   // Enforce Le = 1, unless !unity_Le
   //
   if (unity_Le && (schmidt != prandtl) )
   {
      if (verbose)
        amrex::Print() << "**************** WARNING ***************\n"
                       << "PeleLM::init_once() : currently must have"
                       << "equal Schmidt and Prandtl numbers unless !unity_Le.\n"
                       << "Setting Schmidt = Prandtl\n"
                       << "**************** WARNING ***************\n";
      schmidt = prandtl;
   }
   //
   // We are done.
   //
   num_state_type = desc_lst.size();

   if (verbose)
      amrex::Print() << "PeleLM::init_once(): num_state_type = " << num_state_type << '\n';

   pp.query("plot_reactions",plot_reactions);
   if (plot_reactions)
   {
      auxDiag_names["REACTIONS"].resize(NUM_REACTIONS);
      amrex::Print() << "NUM_REACTIONS = "<< NUM_REACTIONS << '\n';
      for (int i = 0; i < auxDiag_names["REACTIONS"].size(); ++i)
         auxDiag_names["REACTIONS"][i] = amrex::Concatenate("R",i+1);
      amrex::Print() << "***** Make sure to increase amr.regrid_int !!!!!" << '\n';
   }

   pp.query("plot_consumption",plot_consumption);
   pp.query("plot_auxDiags",plot_consumption); // This is for backward comptibility - FIXME
   if (plot_consumption && consumptionName.size()>0)
   {
      auxDiag_names["CONSUMPTION"].resize(consumptionName.size());
      for (int j=0; j<consumptionName.size(); ++j)
      {
         auxDiag_names["CONSUMPTION"][j] = consumptionName[j] + "_ConsumptionRate";
      }
   }

   pp.query("plot_heat_release",plot_heat_release);
   if (plot_heat_release)
   {
      auxDiag_names["HEATRELEASE"].resize(1);
      auxDiag_names["HEATRELEASE"][0] = "HeatRelease";
   }

   init_once_done = 1;
}